

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdSetOptionFundRawTx
              (void *handle,void *fund_handle,int key,int64_t int64_value,double double_value,
              bool bool_value)

{
  CfdException *this;
  allocator local_55;
  int key_local;
  double local_50;
  undefined1 local_48 [32];
  
  key_local = key;
  local_50 = double_value;
  cfd::Initialize();
  std::__cxx11::string::string((string *)local_48,"FundRawTxData",&local_55);
  cfd::capi::CheckBuffer(fund_handle,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  switch(key) {
  case 1:
    *(bool *)((long)fund_handle + 0x68) = bool_value;
    break;
  case 2:
    *(double *)((long)fund_handle + 0x70) = local_50;
    break;
  case 3:
    *(double *)((long)fund_handle + 0x78) = local_50;
    break;
  case 4:
    *(int64_t *)((long)fund_handle + 0x80) = int64_value;
    break;
  case 5:
    *(int *)((long)fund_handle + 0x88) = (int)int64_value;
    break;
  case 6:
    if (-1 < int64_value) {
      *(int *)((long)fund_handle + 0x8c) = (int)int64_value;
    }
    break;
  default:
    local_48._0_8_ = "cfdcapi_transaction.cpp";
    local_48._8_4_ = 0xc9f;
    local_48._16_8_ = "CfdSetOptionFundRawTx";
    cfd::core::logger::warn<int&>((CfdSourceLocation *)local_48,"illegal key {}.",&key_local);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_48,"Failed to parameter. key is illegal.",&local_55);
    cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_48);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  return 0;
}

Assistant:

int CfdSetOptionFundRawTx(
    void* handle, void* fund_handle, int key, int64_t int64_value,
    double double_value, bool bool_value) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);

    switch (key) {
      case kCfdFundTxIsBlind:
        buffer->is_blind = bool_value;
        break;
      case kCfdFundTxDustFeeRate:
        buffer->dust_fee_rate = double_value;
        break;
      case kCfdFundTxLongTermFeeRate:
        buffer->long_term_fee_rate = double_value;
        break;
      case kCfdFundTxKnapsackMinChange:
        buffer->knapsack_min_change = int64_value;
        break;
      case kCfdFundTxBlindExponent:
        buffer->exponent = static_cast<int>(int64_value);
        break;
      case kCfdFundTxBlindMinimumBits:
        if (int64_value >= 0) {
          buffer->minimum_bits = static_cast<int>(int64_value);
        }
        break;
      default:
        warn(CFD_LOG_SOURCE, "illegal key {}.", key);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. key is illegal.");
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}